

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O3

void loguru::syslog_log(void *param_1,Message *message)

{
  int iVar1;
  int iVar2;
  int __pri;
  
  iVar1 = message->verbosity;
  iVar2 = 7;
  if (iVar1 + 3U < 5) {
    iVar2 = iVar1 + 5;
  }
  __pri = 1;
  if (-4 < iVar1) {
    __pri = iVar2;
  }
  syslog(__pri,"%s%s%s",message->indentation,message->prefix,message->message);
  return;
}

Assistant:

void syslog_log(void* /*user_data*/, const Message& message)
	{
		/*
			Level 0: Is reserved for kernel panic type situations.
			Level 1: Is for Major resource failure.
			Level 2->7 Application level failures
		*/
		int level;
		if (message.verbosity < Verbosity_FATAL) {
			level = 1; // System Alert
		} else {
			switch(message.verbosity) {
				case Verbosity_FATAL:   level = 2; break;	// System Critical
				case Verbosity_ERROR:   level = 3; break;	// System Error
				case Verbosity_WARNING: level = 4; break;	// System Warning
				case Verbosity_INFO:    level = 5; break;	// System Notice
				case Verbosity_1:       level = 6; break;	// System Info
				default:                level = 7; break;	// System Debug
			}
		}

		// Note: We don't add the time info.
		// This is done automatically by the syslog deamon.
		// Otherwise log all information that the file log does.
		syslog(level, "%s%s%s", message.indentation, message.prefix, message.message);
	}